

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vepu_common.c
# Opt level: O0

RK_S32 check_stride_by_pixel(RK_S32 workaround,RK_S32 width,RK_S32 hor_stride,RK_S32 pixel_size)

{
  RK_S32 pixel_size_local;
  RK_S32 hor_stride_local;
  RK_S32 width_local;
  RK_S32 workaround_local;
  
  hor_stride_local = workaround;
  if ((workaround == 0) && (hor_stride < width * pixel_size)) {
    _mpp_log_l(4,"vepu_common",
               "warning: stride by bytes %d is smarller than width %d mutiple by pixel size %d\n",
               (char *)0x0,(ulong)(uint)hor_stride,(ulong)(uint)width,pixel_size);
    _mpp_log_l(4,"vepu_common","multiple stride %d by pixel size %d and set new byte stride to %d\n"
               ,(char *)0x0,(ulong)(uint)hor_stride,(ulong)(uint)pixel_size,hor_stride * pixel_size)
    ;
    hor_stride_local = 1;
  }
  return hor_stride_local;
}

Assistant:

static RK_S32 check_stride_by_pixel(RK_S32 workaround, RK_S32 width,
                                    RK_S32 hor_stride, RK_S32 pixel_size)
{
    if (!workaround && hor_stride < width * pixel_size) {
        mpp_log("warning: stride by bytes %d is smarller than width %d mutiple by pixel size %d\n",
                hor_stride, width, pixel_size);
        mpp_log("multiple stride %d by pixel size %d and set new byte stride to %d\n",
                hor_stride, pixel_size, hor_stride * pixel_size);
        workaround = 1;
    }

    return workaround;
}